

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_ca_new_free.c
# Opt level: O0

host_ca * host_ca_new(void)

{
  host_ca *__s;
  host_ca *hca;
  
  __s = (host_ca *)safemalloc(1,0x20,0);
  memset(__s,0,0x20);
  (__s->opts).permit_rsa_sha1 = false;
  (__s->opts).permit_rsa_sha256 = true;
  (__s->opts).permit_rsa_sha512 = true;
  return __s;
}

Assistant:

host_ca *host_ca_new(void)
{
    host_ca *hca = snew(host_ca);
    memset(hca, 0, sizeof(*hca));
    hca->opts.permit_rsa_sha1 = false;
    hca->opts.permit_rsa_sha256 = true;
    hca->opts.permit_rsa_sha512 = true;
    return hca;
}